

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeDrawList
               (ImGuiWindow *window,ImGuiViewportP *viewport,ImDrawList *draw_list,char *label)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImDrawVert *pIVar3;
  ImGuiTable *table;
  ImGuiContext *pIVar4;
  unsigned_short *puVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  ImDrawList *pIVar10;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  ImDrawCmd *pIVar14;
  ImVec4 *buf_00;
  int iVar15;
  long lVar16;
  undefined4 uVar17;
  float fVar18;
  ImGuiListClipper clipper;
  ImVec2 triangle_1 [3];
  char buf [300];
  ImGuiListClipper local_1f8;
  ImGuiContext *local_1d0;
  uint local_1c4;
  ImDrawCmd *local_1c0;
  ImDrawList *local_1b8;
  unsigned_short *local_1b0;
  ImDrawList *local_1a8;
  long local_1a0;
  ulong local_198;
  ImVec2 local_190;
  ImVec2 local_188 [4];
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  iVar15 = (draw_list->CmdBuffer).Size;
  lVar16 = (long)iVar15;
  if ((0 < lVar16) && (pIVar14 = (draw_list->CmdBuffer).Data, pIVar14[lVar16 + -1].ElemCount == 0))
  {
    iVar15 = iVar15 - (uint)(pIVar14[lVar16 + -1].UserCallback == (ImDrawCallback)0x0);
  }
  local_1d0 = GImGui;
  pcVar13 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar13 = draw_list->_OwnerName;
  }
  bVar6 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,pcVar13,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar15);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->DrawList == draw_list) {
    pIVar2->WriteAccessed = true;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar6) {
      return;
    }
  }
  else {
    if (viewport == (ImGuiViewportP *)0x0) {
      pIVar10 = (ImDrawList *)0x0;
    }
    else {
      pIVar10 = GetViewportDrawList(viewport,1,"##Foreground");
    }
    if ((pIVar10 != (ImDrawList *)0x0 && window != (ImGuiWindow *)0x0) &&
       (bVar7 = IsItemHovered(0), bVar7)) {
      local_168[0].y = (window->Pos).y + (window->Size).y;
      local_168[0].x = (window->Pos).x + (window->Size).x;
      ImDrawList::AddRect(pIVar10,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0,1.0);
    }
    if (!bVar6) {
      return;
    }
    if ((window != (ImGuiWindow *)0x0) && (window->WasActive == false)) {
      TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
    }
    if (0 < iVar15) {
      pIVar14 = (draw_list->CmdBuffer).Data;
      local_1a0 = (long)iVar15 * 0x38;
      local_1b8 = pIVar10;
      local_1a8 = draw_list;
      do {
        if (pIVar14->UserCallback == (ImDrawCallback)0x0) {
          ImFormatString((char *)local_168,300,
                         "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         SUB84((double)(pIVar14->ClipRect).x,0),
                         SUB84((double)(pIVar14->ClipRect).y,0),(double)(pIVar14->ClipRect).z,
                         (double)(pIVar14->ClipRect).w,(ulong)pIVar14->ElemCount / 3,
                         pIVar14->TextureId);
          bVar6 = TreeNode((void *)(((long)pIVar14 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                   0x6db6db6db6db6db7),"%s",local_168);
          bVar7 = IsItemHovered(0);
          if (bVar7) {
            bVar7 = (local_1d0->DebugMetricsConfig).ShowDrawCmdMesh;
            if (bVar7 == false) {
              if ((pIVar10 != (ImDrawList *)0x0) &&
                 ((local_1d0->DebugMetricsConfig).ShowDrawCmdBoundingBoxes != false))
              goto LAB_001496e5;
            }
            else if (pIVar10 != (ImDrawList *)0x0) {
LAB_001496e5:
              DebugNodeDrawCmdShowMeshAndBoundingBox
                        (pIVar10,draw_list,pIVar14,bVar7,
                         (local_1d0->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
            }
          }
          if (bVar6) {
            if ((draw_list->IdxBuffer).Size < 1) {
              local_1b0 = (unsigned_short *)0x0;
            }
            else {
              local_1b0 = (draw_list->IdxBuffer).Data;
            }
            uVar1 = pIVar14->VtxOffset;
            uVar8 = pIVar14->IdxOffset;
            pIVar3 = (draw_list->VtxBuffer).Data;
            uVar12 = pIVar14->ElemCount;
            uVar17 = 0;
            if (uVar8 < uVar12 + uVar8) {
              fVar18 = 0.0;
              do {
                local_1f8.DisplayStart = 0;
                local_1f8.DisplayEnd = 0;
                local_1f8.ItemsCount = 0;
                local_1f8.StepNo = 0;
                local_1f8.ItemsFrozen = 0;
                local_1f8.ItemsHeight = 0.0;
                lVar16 = 0;
                do {
                  uVar12 = (uint)((ulong)uVar8 + lVar16);
                  if (local_1b0 != (unsigned_short *)0x0) {
                    uVar12 = (uint)local_1b0[(ulong)uVar8 + lVar16 & 0xffffffff];
                  }
                  *(ImVec2 *)(&local_1f8.DisplayStart + lVar16 * 2) =
                       pIVar3[(ulong)uVar1 + (ulong)uVar12].pos;
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 3);
                fVar18 = fVar18 + ABS(((float)local_1f8.DisplayEnd - (float)local_1f8.StepNo) *
                                      (float)local_1f8.ItemsFrozen +
                                      ((float)local_1f8.StepNo - local_1f8.ItemsHeight) *
                                      (float)local_1f8.DisplayStart +
                                      (local_1f8.ItemsHeight - (float)local_1f8.DisplayEnd) *
                                      (float)local_1f8.ItemsCount) * 0.5;
                uVar12 = pIVar14->ElemCount;
                uVar8 = uVar8 + 3;
              } while (uVar8 < uVar12 + pIVar14->IdxOffset);
              uVar17 = SUB84((double)fVar18,0);
              uVar8 = pIVar14->IdxOffset;
            }
            ImFormatString((char *)local_168,300,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           uVar17,(ulong)uVar12,(ulong)pIVar14->VtxOffset,(ulong)uVar8);
            local_1f8.DisplayStart = 0;
            local_1f8.DisplayEnd = 0;
            Selectable((char *)local_168,false,0,(ImVec2 *)&local_1f8);
            bVar6 = IsItemHovered(0);
            if (pIVar10 != (ImDrawList *)0x0 && bVar6) {
              DebugNodeDrawCmdShowMeshAndBoundingBox(pIVar10,draw_list,pIVar14,true,false);
            }
            local_1f8.DisplayStart = 0;
            local_1f8.DisplayEnd = 0;
            local_1f8.StepNo = 0;
            local_1f8.ItemsFrozen = 0;
            local_1f8.ItemsHeight = 0.0;
            local_1f8.StartPosY = 0.0;
            local_1f8.ItemsCount = -1;
            uVar8 = pIVar14->ElemCount;
            pIVar2 = GImGui->CurrentWindow;
            table = GImGui->CurrentTable;
            local_1c0 = pIVar14;
            if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
              TableEndRow(table);
            }
            local_1f8.StartPosY = (pIVar2->DC).CursorPos.y;
            local_1f8.ItemsHeight = -1.0;
            local_1f8.ItemsCount = uVar8 / 3;
            local_1f8.StepNo = 0;
            local_1f8.ItemsFrozen = 0;
            local_1f8.DisplayStart = -1;
            local_1f8.DisplayEnd = 0;
            while (bVar6 = ImGuiListClipper::Step(&local_1f8), bVar6) {
              local_1c4 = local_1f8.DisplayEnd;
              if (local_1f8.DisplayStart < local_1f8.DisplayEnd) {
                iVar15 = local_1f8.DisplayStart * 3 + local_1c0->IdxOffset;
                uVar8 = local_1f8.DisplayStart;
                do {
                  puVar5 = local_1b0;
                  local_198 = (ulong)uVar8;
                  local_188[0].x = 0.0;
                  local_188[0].y = 0.0;
                  local_188[1].x = 0.0;
                  local_188[1].y = 0.0;
                  local_188[2].x = 0.0;
                  local_188[2].y = 0.0;
                  lVar16 = 0;
                  buf_00 = local_168;
                  do {
                    if (local_1b0 == (unsigned_short *)0x0) {
                      uVar8 = iVar15 + (int)lVar16;
                    }
                    else {
                      uVar8 = (uint)puVar5[iVar15 + lVar16];
                    }
                    lVar11 = (long)(int)uVar8;
                    local_188[lVar16] = pIVar3[(ulong)uVar1 + lVar11].pos;
                    pcVar13 = "     ";
                    if (lVar16 == 0) {
                      pcVar13 = "Vert:";
                    }
                    iVar9 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                           "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                           SUB84((double)pIVar3[(ulong)uVar1 + lVar11].pos.x,0),
                                           SUB84((double)pIVar3[(ulong)uVar1 + lVar11].pos.y,0),
                                           (double)pIVar3[(ulong)uVar1 + lVar11].uv.x,
                                           (double)pIVar3[(ulong)uVar1 + lVar11].uv.y,pcVar13,
                                           (ulong)(uint)(iVar15 + (int)lVar16),
                                           (ulong)pIVar3[(ulong)uVar1 + lVar11].col);
                    buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar9);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 3);
                  local_190.x = 0.0;
                  local_190.y = 0.0;
                  Selectable((char *)local_168,false,0,&local_190);
                  pIVar10 = local_1b8;
                  if ((local_1b8 != (ImDrawList *)0x0) && (bVar6 = IsItemHovered(0), bVar6)) {
                    uVar8 = pIVar10->Flags;
                    pIVar10->Flags = uVar8 & 0xfffffffe;
                    ImDrawList::AddPolyline(pIVar10,local_188,3,0xff00ffff,1,1.0);
                    pIVar10->Flags = uVar8;
                  }
                  iVar15 = iVar15 + 3;
                  uVar8 = (int)local_198 + 1;
                } while (uVar8 != local_1c4);
              }
            }
            TreePop();
            pIVar14 = local_1c0;
            draw_list = local_1a8;
            pIVar10 = local_1b8;
            if ((float)local_1f8.ItemsCount != -NAN) {
              __assert_fail("ItemsCount == -1 && \"Forgot to call End(), or to Step() until false?\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                            ,0x934,"ImGuiListClipper::~ImGuiListClipper()");
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar14->UserCallback,pIVar14->UserCallbackData);
        }
        pIVar14 = pIVar14 + 1;
      } while (pIVar14 < (ImDrawCmd *)
                         ((long)&(((draw_list->CmdBuffer).Data)->ClipRect).x + local_1a0));
    }
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = viewport ? GetForegroundDrawList(viewport) : NULL; // Render additional visuals into the top-most draw list
    if (window && fg_draw_list && IsItemHovered())
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
            pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}